

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
checkInterfacePropertyCompatibility<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_6)

{
  pointer pcVar1;
  cmLocalGenerator *localGenerator;
  cmGeneratorTarget *pcVar2;
  char *pcVar3;
  pointer pbVar4;
  int iVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar7;
  cmGeneratorExpressionInterpreter *this;
  ostream *poVar8;
  size_t sVar9;
  pointer ppcVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  bool bVar11;
  bool bVar12;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  consistent;
  string reportEntry;
  string report;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ifacePropContent;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  string interfaceProperty;
  cmGeneratorExpressionInterpreter *local_3b0;
  undefined1 local_3a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  cmGeneratorTarget *local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_378;
  undefined1 *local_370;
  long local_368;
  undefined1 local_360;
  undefined7 uStack_35f;
  string local_350;
  string local_330;
  char *local_310;
  size_type local_308;
  char local_300;
  undefined7 uStack_2ff;
  undefined8 uStack_2f8;
  string local_2f0;
  _Base_ptr local_2d0;
  _Base_ptr local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  char *local_2b8;
  size_type local_2b0;
  char local_2a8;
  undefined7 uStack_2a7;
  undefined8 uStack_2a0;
  char *local_298;
  size_type local_290;
  char local_288;
  undefined7 uStack_287;
  undefined8 uStack_280;
  undefined1 local_278 [17];
  undefined7 uStack_267;
  undefined8 uStack_260;
  ios_base local_208 [264];
  char *local_100;
  pointer local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  pointer local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_378 = __return_storage_ptr__;
  local_100 = defaultValue;
  getTypedProperty<std::__cxx11::string>
            (__return_storage_ptr__,tgt,p,(cmGeneratorExpressionInterpreter *)0x0);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_a8,tgt);
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar11 = _Var6._M_current !=
           local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2c8 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_2c0 = local_a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_2d0 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_2c8 != local_2d0 &&
      _Var6._M_current !=
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x11f0,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = std::basic_string<char>]"
                 );
  }
  pvVar7 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar7->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar7->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330," * Target \"","");
    std::__cxx11::string::_M_append((char *)&local_330,(ulong)(tgt->Target->Name)._M_dataplus._M_p);
    local_380 = tgt;
    local_f0 = _Var6._M_current;
    if (_Var6._M_current != local_2c0) {
      std::__cxx11::string::append((char *)&local_330);
      pcVar1 = (local_378->_M_dataplus)._M_p;
      local_298 = &local_288;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,pcVar1,pcVar1 + local_378->_M_string_length);
      if (local_298 == &local_288) {
        uStack_260 = uStack_280;
        local_278._0_8_ = local_278 + 0x10;
      }
      else {
        local_278._0_8_ = local_298;
      }
      uStack_267 = uStack_287;
      local_278[0x10] = local_288;
      local_278._8_8_ = local_290;
      local_290 = 0;
      local_288 = '\0';
      local_298 = &local_288;
      std::__cxx11::string::_M_append((char *)&local_330,local_278._0_8_);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,stack0xfffffffffffffd98 + 1);
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,CONCAT71(uStack_287,local_288) + 1);
      }
    }
    pcVar2 = local_380;
    std::__cxx11::string::append((char *)&local_330);
    std::operator+(&local_50,"INTERFACE_",p);
    iVar5 = std::__cxx11::string::compare((char *)p);
    if (iVar5 == 0) {
      this = (cmGeneratorExpressionInterpreter *)operator_new(0x68);
      localGenerator = pcVar2->LocalGenerator;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      pcVar1 = (config->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar1,pcVar1 + config->_M_string_length);
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                (this,localGenerator,&local_c8,pcVar2,&local_70);
      local_3b0 = this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      local_3b0 = (cmGeneratorExpressionInterpreter *)0x0;
    }
    if ((iVar5 == 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2)) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    ppcVar10 = (pvVar7->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_f8 = (pvVar7->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    lhs = local_378;
    if (ppcVar10 != local_f8) {
      do {
        pcVar2 = *ppcVar10;
        local_e8 = ppcVar10;
        cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_e0,pcVar2);
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_e0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_e0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        pbVar4 = local_e0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        getTypedProperty<std::__cxx11::string>(&local_2f0,pcVar2,&local_50,local_3b0);
        local_370 = &local_360;
        local_368 = 0;
        local_360 = 0;
        if (_Var6._M_current != pbVar4) {
          std::__cxx11::string::append((char *)&local_370);
          std::__cxx11::string::_M_append
                    ((char *)&local_370,(ulong)(pcVar2->Target->Name)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_370);
          local_310 = &local_300;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_310,local_2f0._M_dataplus._M_p,
                     local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
          local_278._0_8_ = local_278 + 0x10;
          if (local_310 == &local_300) {
            uStack_260 = uStack_2f8;
          }
          else {
            local_278._0_8_ = local_310;
          }
          uStack_267 = uStack_2ff;
          local_278[0x10] = local_300;
          local_278._8_8_ = local_308;
          local_308 = 0;
          local_300 = '\0';
          local_310 = &local_300;
          std::__cxx11::string::_M_append((char *)&local_370,local_278._0_8_);
          if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
            operator_delete((void *)local_278._0_8_,stack0xfffffffffffffd98 + 1);
          }
          if (local_310 != &local_300) {
            operator_delete(local_310,CONCAT71(uStack_2ff,local_300) + 1);
          }
          std::__cxx11::string::append((char *)&local_370);
        }
        if (local_f0 == local_2c0) {
          if (local_2c8 == local_2d0) {
            if (_Var6._M_current == pbVar4) goto LAB_00340121;
            if (bVar11) {
              consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_3a8,lhs,&local_2f0,t);
              std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_370);
              sVar9 = lhs->_M_string_length;
              bVar12 = true;
              if (sVar9 == local_3a8._16_8_) {
                if (sVar9 == 0) {
                  bVar12 = false;
                }
                else {
                  iVar5 = bcmp((lhs->_M_dataplus)._M_p,(void *)local_3a8._8_8_,sVar9);
                  bVar12 = iVar5 != 0;
                }
              }
              compatibilityAgree_abi_cxx11_((string *)local_278,t,bVar12);
              std::__cxx11::string::_M_append((char *)&local_330,local_278._0_8_);
              if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                operator_delete((void *)local_278._0_8_,stack0xfffffffffffffd98 + 1);
              }
              if (local_3a8[0] == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_278,"The INTERFACE_",0xe);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_278,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8," property of \"",0xe);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,(pcVar2->Target->Name)._M_dataplus._M_p,
                                    (pcVar2->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"\" does\nnot agree with the value of ",0x23);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8," already determined\nfor \"",0x19);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,(local_380->Target->Name)._M_dataplus._M_p,
                                    (local_380->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".\n",3);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_350);
                goto LAB_00340691;
              }
              iVar5 = 3;
              std::__cxx11::string::_M_assign((string *)lhs);
              goto LAB_003406d5;
            }
            local_278._0_8_ = local_278 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_278,local_370,local_370 + local_368);
            std::__cxx11::string::append((char *)local_278);
            std::__cxx11::string::_M_append((char *)&local_330,local_278._0_8_);
            if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
              operator_delete((void *)local_278._0_8_,stack0xfffffffffffffd98 + 1);
            }
            std::__cxx11::string::_M_assign((string *)lhs);
            iVar5 = 0;
            bVar11 = true;
          }
          else {
            local_90[0] = local_80;
            pcVar1 = (lhs->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,pcVar1,pcVar1 + lhs->_M_string_length);
            local_278._8_8_ = 0;
            stack0xfffffffffffffd98 = stack0xfffffffffffffd98 & 0xffffffffffffff00;
            local_278._0_8_ = local_278 + 0x10;
            std::__cxx11::string::operator=((string *)lhs,(string *)local_278);
            if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
              operator_delete((void *)local_278._0_8_,stack0xfffffffffffffd98 + 1);
            }
            if (local_90[0] != local_80) {
              operator_delete(local_90[0],local_80[0] + 1);
            }
            lhs = local_378;
            if (_Var6._M_current != pbVar4) {
              consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_3a8,local_378,&local_2f0,t);
              std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_370);
              sVar9 = lhs->_M_string_length;
              bVar12 = true;
              if (sVar9 == local_3a8._16_8_) {
                if (sVar9 == 0) {
                  bVar12 = false;
                }
                else {
                  iVar5 = bcmp((lhs->_M_dataplus)._M_p,(void *)local_3a8._8_8_,sVar9);
                  bVar12 = iVar5 != 0;
                }
              }
              compatibilityAgree_abi_cxx11_((string *)local_278,t,bVar12);
              std::__cxx11::string::_M_append((char *)&local_330,local_278._0_8_);
              if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                operator_delete((void *)local_278._0_8_,stack0xfffffffffffffd98 + 1);
              }
              if (local_3a8[0] == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_278,"Property ",9);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_278,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8," on target \"",0xc);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,(local_380->Target->Name)._M_dataplus._M_p,
                                    (local_380->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"\" is\nimplied to be ",0x13);
                pcVar3 = local_100;
                if (local_100 == (char *)0x0) {
                  std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar9 = strlen(local_100);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar3,sVar9);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8," property on\ndependency \"",0x19);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,(pcVar2->Target->Name)._M_dataplus._M_p,
                                    (pcVar2->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_350);
                goto LAB_00340691;
              }
              iVar5 = 3;
              std::__cxx11::string::_M_assign((string *)lhs);
              goto LAB_003406d5;
            }
            iVar5 = 3;
          }
        }
        else if (_Var6._M_current == pbVar4) {
LAB_00340121:
          iVar5 = 3;
        }
        else {
          consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_3a8,lhs,&local_2f0,t);
          std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_370);
          sVar9 = lhs->_M_string_length;
          bVar12 = true;
          if (sVar9 == local_3a8._16_8_) {
            if (sVar9 == 0) {
              bVar12 = false;
            }
            else {
              iVar5 = bcmp((lhs->_M_dataplus)._M_p,(void *)local_3a8._8_8_,sVar9);
              bVar12 = iVar5 != 0;
            }
          }
          compatibilityAgree_abi_cxx11_((string *)local_278,t,bVar12);
          std::__cxx11::string::_M_append((char *)&local_330,local_278._0_8_);
          if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
            operator_delete((void *)local_278._0_8_,stack0xfffffffffffffd98 + 1);
          }
          if (local_3a8[0] == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Property ",9);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_278,(p->_M_dataplus)._M_p,p->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," on target \"",0xc);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(local_380->Target->Name)._M_dataplus._M_p,
                                (local_380->Target->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\" does\nnot match the INTERFACE_",0x1f);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(p->_M_dataplus)._M_p,p->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," property requirement\nof dependency \"",0x25);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(pcVar2->Target->Name)._M_dataplus._M_p,
                                (pcVar2->Target->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".\n",3);
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_350);
LAB_00340691:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_dataplus._M_p != &local_350.field_2) {
              operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
            std::ios_base::~ios_base(local_208);
            iVar5 = 2;
          }
          else {
            iVar5 = 3;
            std::__cxx11::string::_M_assign((string *)lhs);
          }
LAB_003406d5:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._8_8_ != &local_390) {
            operator_delete((void *)local_3a8._8_8_,local_390._M_allocated_capacity + 1);
          }
        }
        if (local_370 != &local_360) {
          operator_delete(local_370,CONCAT71(uStack_35f,local_360) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_e0);
      } while (((iVar5 == 3) || (iVar5 == 0)) && (ppcVar10 = local_e8 + 1, ppcVar10 != local_f8));
    }
    pcVar1 = (lhs->_M_dataplus)._M_p;
    local_2b8 = &local_2a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b8,pcVar1,pcVar1 + lhs->_M_string_length);
    pcVar2 = local_380;
    if (local_2b8 == &local_2a8) {
      uStack_260 = uStack_2a0;
      local_278._0_8_ = local_278 + 0x10;
    }
    else {
      local_278._0_8_ = local_2b8;
    }
    uStack_267 = uStack_2a7;
    local_278[0x10] = local_2a8;
    local_278._8_8_ = local_2b0;
    local_2b0 = 0;
    local_2a8 = '\0';
    local_2b8 = &local_2a8;
    compatibilityType_abi_cxx11_((string *)local_3a8,t);
    cmGeneratorTarget::ReportPropertyOrigin
              (pcVar2,p,(string *)local_278,&local_330,(string *)local_3a8);
    if ((undefined1 *)CONCAT71(local_3a8._1_7_,local_3a8[0]) != local_3a8 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_3a8._1_7_,local_3a8[0]),local_3a8._16_8_ + 1);
    }
    if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
      operator_delete((void *)local_278._0_8_,stack0xfffffffffffffd98 + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT71(uStack_2a7,local_2a8) + 1);
    }
    if (local_3b0 != (cmGeneratorExpressionInterpreter *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_3b0,local_3b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return local_378;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter(
    p == "POSITION_INDEPENDENT_CODE" ? new cmGeneratorExpressionInterpreter(
                                         tgt->GetLocalGenerator(), config, tgt)
                                     : nullptr);

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}